

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

void __thiscall
capnp::SchemaLoader::Impl::Impl(Impl *this,SchemaLoader *loader,LazyLoadCallback *callback)

{
  LazyLoadCallback *callback_local;
  SchemaLoader *loader_local;
  Impl *this_local;
  
  kj::Arena::Arena(&this->arena,0x400);
  kj::HashSet<kj::ArrayPtr<const_unsigned_char>_>::HashSet(&this->dedupTable);
  kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::HashMap(&this->schemas);
  kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::
  HashMap(&this->brands);
  kj::HashMap<const_capnp::_::RawSchema_*,_capnp::_::RawBrandedSchema_*>::HashMap
            (&this->unboundBrands);
  kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::HashMap
            (&this->structSizeRequirements);
  InitializerImpl::InitializerImpl(&this->initializer,loader,callback);
  BrandedInitializerImpl::BrandedInitializerImpl(&this->brandedInitializer,loader);
  return;
}

Assistant:

inline Impl(const SchemaLoader& loader, const LazyLoadCallback& callback)
      : initializer(loader, callback), brandedInitializer(loader) {}